

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall pbrt::syntactic::ParamArray<bool>::add(ParamArray<bool> *this,string *text)

{
  bool __x;
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __x = std::operator==(text,"true");
  if (!__x) {
    bVar1 = std::operator==(text,"false");
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_58,"invalid value \'",text);
      std::operator+(&local_38,&bStack_58,"\' for bool parameter");
      std::runtime_error::runtime_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            (&this->super_vector<bool,_std::allocator<bool>_>,__x);
  return;
}

Assistant:

void ParamArray<bool>::add(const std::string &text)
    { 
      if (text == "true")
        this->push_back(true); 
      else if (text == "false")
        this->push_back(false); 
      else
        throw std::runtime_error("invalid value '"+text+"' for bool parameter");
    }